

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O2

void TranslateSequence(ExpressionTranslateContext *ctx,ExprSequence *expression)

{
  ExprBase **ppEVar1;
  uint index;
  char *format;
  
  if ((expression->expressions).count == 0) {
    format = "/*empty sequence*/";
  }
  else {
    Print(ctx,"(");
    PrintLine(ctx);
    ctx->depth = ctx->depth + 1;
    index = 0;
    while (index < (expression->expressions).count) {
      PrintIndent(ctx);
      ppEVar1 = SmallArray<ExprBase_*,_4U>::operator[](&expression->expressions,index);
      Translate(ctx,*ppEVar1);
      index = index + 1;
      if (index < (expression->expressions).count) {
        Print(ctx,", ");
      }
      PrintLine(ctx);
    }
    ctx->depth = ctx->depth - 1;
    PrintIndent(ctx);
    format = ")";
  }
  Print(ctx,format);
  return;
}

Assistant:

void TranslateSequence(ExpressionTranslateContext &ctx, ExprSequence *expression)
{
	if(expression->expressions.empty())
	{
		Print(ctx, "/*empty sequence*/");
		return;
	}

	Print(ctx, "(");
	PrintLine(ctx);

	ctx.depth++;

	for(unsigned i = 0; i < expression->expressions.size(); i++)
	{
		PrintIndent(ctx);

		Translate(ctx, expression->expressions[i]);

		if(i + 1 < expression->expressions.size())
			Print(ctx, ", ");

		PrintLine(ctx);
	}

	ctx.depth--;

	PrintIndent(ctx);
	Print(ctx, ")");
}